

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  bool bVar1;
  float fVar2;
  ImVec2 IVar3;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_104;
  float local_100;
  float local_f8;
  float local_f4;
  int local_e4;
  ImVec2 local_d0;
  float local_c8;
  float local_c4;
  float avail_h;
  float avail_w;
  ImGuiDir dir_1;
  int n_1;
  ImGuiDir dir_prefered_order_1 [4];
  ImRect local_a0;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImGuiDir local_70;
  int local_6c;
  ImGuiDir dir;
  int n;
  ImGuiDir dir_prefered_order [4];
  float local_44;
  float fStack_40;
  ImVec2 base_pos_clamped;
  ImGuiPopupPositionPolicy policy_local;
  ImRect *r_avoid_local;
  ImRect *r_outer_local;
  ImGuiDir *last_dir_local;
  ImVec2 *size_local;
  ImVec2 *ref_pos_local;
  ImVec2 pos;
  
  IVar3 = operator-(&r_outer->Max,size);
  IVar3 = ImClamp(ref_pos,&r_outer->Min,IVar3);
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    _dir = 0x100000003;
    dir_prefered_order[0] = 0;
    dir_prefered_order[1] = 2;
    local_6c = 0;
    if (*last_dir != -1) {
      local_6c = -1;
    }
    for (; local_6c < 4; local_6c = local_6c + 1) {
      if (local_6c == -1) {
        local_e4 = *last_dir;
      }
      else {
        local_e4 = (&dir)[local_6c];
      }
      local_70 = local_e4;
      if ((local_6c == -1) || (local_e4 != *last_dir)) {
        ImVec2::ImVec2((ImVec2 *)&ref_pos_local);
        if (local_70 == 3) {
          ImVec2::ImVec2(&local_78,(r_avoid->Min).x,(r_avoid->Max).y);
          ref_pos_local = (ImVec2 *)local_78;
        }
        if (local_70 == 1) {
          ImVec2::ImVec2(&local_80,(r_avoid->Min).x,(r_avoid->Min).y - size->y);
          ref_pos_local = (ImVec2 *)local_80;
        }
        if (local_70 == 0) {
          ImVec2::ImVec2(&local_88,(r_avoid->Max).x - size->x,(r_avoid->Max).y);
          ref_pos_local = (ImVec2 *)local_88;
        }
        if (local_70 == 2) {
          ImVec2::ImVec2(&local_90,(r_avoid->Max).x - size->x,(r_avoid->Min).y - size->y);
          ref_pos_local = (ImVec2 *)local_90;
        }
        dir_prefered_order_1._8_8_ = operator+((ImVec2 *)&ref_pos_local,size);
        ImRect::ImRect(&local_a0,(ImVec2 *)&ref_pos_local,(ImVec2 *)(dir_prefered_order_1 + 2));
        bVar1 = ImRect::Contains(r_outer,&local_a0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          *last_dir = local_70;
          return (ImVec2)ref_pos_local;
        }
      }
    }
  }
  if ((policy == ImGuiPopupPositionPolicy_Tooltip) || (policy == ImGuiPopupPositionPolicy_Default))
  {
    _dir_1 = 0x300000001;
    dir_prefered_order_1[0] = 2;
    dir_prefered_order_1[1] = 0;
    avail_w = 0.0;
    if (*last_dir != -1) {
      avail_w = -NAN;
    }
    for (; (int)avail_w < 4; avail_w = (float)((int)avail_w + 1)) {
      if (avail_w == -NAN) {
        local_f4 = (float)*last_dir;
      }
      else {
        local_f4 = (float)(&dir_1)[(int)avail_w];
      }
      avail_h = local_f4;
      if ((avail_w == -NAN) || (local_f4 != (float)*last_dir)) {
        if (local_f4 == 0.0) {
          local_f8 = (r_avoid->Min).x;
        }
        else {
          local_f8 = (r_outer->Max).x;
        }
        if (local_f4 == 1.4013e-45) {
          local_100 = (r_avoid->Max).x;
        }
        else {
          local_100 = (r_outer->Min).x;
        }
        local_c4 = local_f8 - local_100;
        if (local_f4 == 2.8026e-45) {
          local_104 = (r_avoid->Min).y;
        }
        else {
          local_104 = (r_outer->Max).y;
        }
        if (local_f4 == 4.2039e-45) {
          local_10c = (r_avoid->Max).y;
        }
        else {
          local_10c = (r_outer->Min).y;
        }
        local_c8 = local_104 - local_10c;
        if (((size->x <= local_c4) || ((local_f4 != 0.0 && (local_f4 != 1.4013e-45)))) &&
           ((size->y <= local_c8 || ((local_f4 != 2.8026e-45 && (local_f4 != 4.2039e-45)))))) {
          ImVec2::ImVec2((ImVec2 *)&ref_pos_local);
          if (avail_h == 0.0) {
            local_110 = (r_avoid->Min).x - size->x;
          }
          else {
            if (avail_h == 1.4013e-45) {
              local_114 = (r_avoid->Max).x;
            }
            else {
              local_44 = IVar3.x;
              local_114 = local_44;
            }
            local_110 = local_114;
          }
          if (avail_h == 2.8026e-45) {
            local_118 = (r_avoid->Min).y - size->y;
          }
          else {
            if (avail_h == 4.2039e-45) {
              local_11c = (r_avoid->Max).y;
            }
            else {
              fStack_40 = IVar3.y;
              local_11c = fStack_40;
            }
            local_118 = local_11c;
          }
          ref_pos_local = (ImVec2 *)CONCAT44(local_118,local_110);
          fVar2 = ImMax<float>(local_110,(r_outer->Min).x);
          ref_pos_local = (ImVec2 *)CONCAT44(ref_pos_local._4_4_,fVar2);
          fVar2 = ImMax<float>(ref_pos_local._4_4_,(r_outer->Min).y);
          ref_pos_local = (ImVec2 *)CONCAT44(fVar2,ref_pos_local._0_4_);
          *last_dir = (ImGuiDir)avail_h;
          return (ImVec2)ref_pos_local;
        }
      }
    }
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    ImVec2::ImVec2(&local_d0,2.0,2.0);
    ref_pos_local = (ImVec2 *)operator+(ref_pos,&local_d0);
  }
  else {
    ref_pos_local = *(ImVec2 **)ref_pos;
    fVar2 = ImMin<float>(ref_pos_local._0_4_ + size->x,(r_outer->Max).x);
    fVar2 = ImMax<float>(fVar2 - size->x,(r_outer->Min).x);
    ref_pos_local = (ImVec2 *)CONCAT44(ref_pos_local._4_4_,fVar2);
    fVar2 = ImMin<float>(ref_pos_local._4_4_ + size->y,(r_outer->Max).y);
    fVar2 = ImMax<float>(fVar2 - size->y,(r_outer->Min).y);
    ref_pos_local = (ImVec2 *)CONCAT44(fVar2,ref_pos_local._0_4_);
  }
  return (ImVec2)ref_pos_local;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}